

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall QFormLayoutPrivate::setupVerticalLayoutData(QFormLayoutPrivate *this,int width)

{
  QList<QLayoutStruct> *this_00;
  ItemMatrix *this_01;
  QLayout *layout;
  long lVar1;
  long lVar2;
  QFormLayoutItem *this_02;
  QFormLayoutItem *this_03;
  uint uVar3;
  bool recalculate;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  RowWrapPolicy RVar7;
  int userVSpacing;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Alignment AVar12;
  pointer ppQVar13;
  QSize QVar14;
  pointer pQVar15;
  QWidget *pQVar16;
  pointer pQVar17;
  QSize QVar18;
  QFormLayoutItem *prevItem1;
  Representation RVar19;
  ulong uVar20;
  Representation RVar21;
  long lVar22;
  uint uVar23;
  QFormLayoutItem *local_a0;
  QStyle *local_90;
  int local_80;
  int local_7c;
  uint local_78;
  int local_74;
  
  layout = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
  if (((this->layoutWidth != width) &&
      (this->layoutWidth < this->thresh_width || width < this->thresh_width)) ||
     ((this->field_0xb2 & 0x3c) != 0)) {
    this->layoutWidth = width;
    uVar20 = (this->m_matrix).m_storage.d.size;
    RVar7 = QFormLayout::rowWrapPolicy((QFormLayout *)layout);
    this_00 = &this->vLayouts;
    QList<QLayoutStruct>::clear(this_00);
    uVar3 = (uint)(uVar20 >> 1);
    QList<QLayoutStruct>::resize(this_00,(long)(int)(uVar3 * 2 + 2));
    userVSpacing = *(int *)(*(long *)&layout->field_0x8 + 0x164);
    if (userVSpacing < 0) {
      userVSpacing = qSmartSpacing(layout,PM_LayoutVerticalSpacing);
    }
    if ((userVSpacing < 0) && (pQVar16 = QLayout::parentWidget(layout), pQVar16 != (QWidget *)0x0))
    {
      local_90 = QWidget::style(pQVar16);
    }
    else {
      local_90 = (QStyle *)0x0;
    }
    this_01 = &this->m_matrix;
    updateSizes(this);
    this->maxLabelWidth = 0;
    if (RVar7 == WrapAllRows) {
      this->maxLabelWidth = width;
    }
    else if (0 < (int)uVar3) {
      uVar20 = (ulong)(uVar3 & 0x7fffffff);
      lVar22 = 0;
      do {
        ppQVar13 = QList<QFormLayoutItem_*>::data(&this_01->m_storage);
        lVar1 = *(long *)((long)ppQVar13 + lVar22);
        ppQVar13 = QList<QFormLayoutItem_*>::data(&this_01->m_storage);
        if (lVar1 != 0) {
          lVar2 = *(long *)((long)ppQVar13 + lVar22 + 8);
          if (lVar2 == 0) {
            iVar11 = 0;
          }
          else {
            iVar11 = *(int *)(lVar2 + 0xc);
          }
          iVar9 = *(int *)(lVar1 + 0x14);
          if (iVar11 + iVar9 <= width) {
            if (iVar9 < this->maxLabelWidth) {
              iVar9 = this->maxLabelWidth;
            }
            this->maxLabelWidth = iVar9;
          }
        }
        lVar22 = lVar22 + 0x10;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
    if ((int)uVar3 < 1) {
      uVar23 = 1;
      bVar6 = true;
    }
    else {
      bVar6 = true;
      lVar22 = 0;
      uVar23 = 1;
      local_a0 = (QFormLayoutItem *)0x0;
      prevItem1 = (QFormLayoutItem *)0x0;
      uVar20 = 0;
      recalculate = false;
      do {
        ppQVar13 = QList<QFormLayoutItem_*>::data(&this_01->m_storage);
        this_02 = *(QFormLayoutItem **)((long)ppQVar13 + lVar22);
        ppQVar13 = QList<QFormLayoutItem_*>::data(&this_01->m_storage);
        this_03 = *(QFormLayoutItem **)((long)ppQVar13 + lVar22 + 8);
        bVar4 = QFormLayout::isRowVisible((QFormLayout *)layout,(int)uVar20);
        if (bVar4) {
          iVar9 = -1;
          QVar14.wd.m_i = -1;
          QVar14.ht.m_i = 0;
          RVar19.m_i = -1;
          iVar11 = -1;
          if (this_02 != (QFormLayoutItem *)0x0) {
            iVar11 = (this_02->minSize).ht.m_i;
            QVar14 = this_02->sizeHint;
            RVar19 = QVar14.ht.m_i;
          }
          QVar18.wd.m_i = -1;
          QVar18.ht.m_i = 0;
          RVar21.m_i = -1;
          if (this_03 != (QFormLayoutItem *)0x0) {
            QVar18 = this_03->minSize;
            RVar21 = QVar18.ht.m_i;
            iVar9 = (this_03->sizeHint).ht.m_i;
          }
          if (RVar7 == WrapLongRows) {
            bVar4 = true;
            if (QVar14.wd.m_i.m_i <= this->maxLabelWidth) {
              bVar4 = width < this->maxLabelWidth + QVar18.wd.m_i.m_i;
            }
          }
          else {
            bVar4 = false;
          }
          if ((RVar7 == WrapAllRows) || (bVar4 != false)) {
            if (this_02 != (QFormLayoutItem *)0x0) {
              pQVar15 = QList<QLayoutStruct>::data(this_00);
              iVar9 = QFormLayoutItem::vStretch(this_02);
              iVar11 = (this_02->minSize).ht.m_i;
              pQVar15[(int)uVar23].stretch = iVar9;
              pQVar15[(int)uVar23].sizeHint = iVar11;
              pQVar15[(int)uVar23].minimumSize = iVar11;
              pQVar15[(int)uVar23].maximumSize = 0x7ffff;
              pQVar15[(int)uVar23].expansive = false;
              pQVar15[(int)uVar23].empty = true;
              pQVar15[(int)uVar23].spacing = 0;
              pQVar15[(int)uVar23].sizeHint = (this_02->sizeHint).ht.m_i;
              pQVar15[(int)uVar23].maximumSize = (this_02->maxSize).ht.m_i;
              iVar11 = (*this_02->item->_vptr_QLayoutItem[5])();
              pQVar15[(int)uVar23].expansive = (bool)((byte)iVar11 >> 1 & 1);
              pQVar15[(int)uVar23].empty = false;
              if (1 < (int)uVar23) {
                pQVar16 = QLayout::parentWidget(layout);
                iVar11 = spacingHelper(pQVar16,local_90,userVSpacing,(bool)(bVar4 | recalculate),
                                       this_02,(QFormLayoutItem *)0x0,prevItem1,local_a0);
                pQVar15 = QList<QLayoutStruct>::data(this_00);
                pQVar15[(ulong)uVar23 - 1].spacing = iVar11;
              }
              this_02->vLayoutIndex = uVar23;
              this_02->sideBySide = false;
              pQVar15 = QList<QLayoutStruct>::data(this_00);
              if (0 < pQVar15[(int)uVar23].stretch) {
                bVar6 = false;
              }
              uVar23 = uVar23 + 1;
              local_a0 = (QFormLayoutItem *)0x0;
              prevItem1 = this_02;
            }
            if (this_03 != (QFormLayoutItem *)0x0) {
              pQVar15 = QList<QLayoutStruct>::data(this_00);
              iVar9 = QFormLayoutItem::vStretch(this_03);
              iVar11 = (this_03->minSize).ht.m_i;
              pQVar15[(int)uVar23].stretch = iVar9;
              pQVar15[(int)uVar23].sizeHint = iVar11;
              pQVar15[(int)uVar23].minimumSize = iVar11;
              pQVar15[(int)uVar23].maximumSize = 0x7ffff;
              pQVar15[(int)uVar23].expansive = false;
              pQVar15[(int)uVar23].empty = true;
              pQVar15[(int)uVar23].spacing = 0;
              pQVar15[(int)uVar23].sizeHint = (this_03->sizeHint).ht.m_i;
              pQVar15[(int)uVar23].maximumSize = (this_03->maxSize).ht.m_i;
              iVar11 = (*this_03->item->_vptr_QLayoutItem[5])();
              pQVar15[(int)uVar23].expansive = (bool)((byte)iVar11 >> 1 & 1);
              pQVar15[(int)uVar23].empty = false;
              if (1 < (int)uVar23) {
                pQVar16 = QLayout::parentWidget(layout);
                iVar11 = spacingHelper(pQVar16,local_90,userVSpacing,(bool)(bVar4 | recalculate),
                                       this_03,(QFormLayoutItem *)0x0,prevItem1,local_a0);
                pQVar15 = QList<QLayoutStruct>::data(this_00);
                pQVar15[(ulong)uVar23 - 1].spacing = iVar11;
              }
              this_03->vLayoutIndex = uVar23;
              this_03->sideBySide = false;
              pQVar15 = QList<QLayoutStruct>::data(this_00);
              if (0 < pQVar15[(int)uVar23].stretch) {
                bVar6 = false;
              }
              uVar23 = uVar23 + 1;
              local_a0 = (QFormLayoutItem *)0x0;
              prevItem1 = this_03;
            }
          }
          else {
            iVar10 = 0;
            if (this_02 == (QFormLayoutItem *)0x0) {
              local_80 = 0;
              local_7c = 0xffffff;
              local_78 = 0;
            }
            else {
              local_7c = (this_02->maxSize).ht.m_i;
              uVar8 = (*this_02->item->_vptr_QLayoutItem[5])();
              local_78 = uVar8 >> 1 & 0x7f;
              this_02->sideBySide = this_03 != (QFormLayoutItem *)0x0;
              this_02->vLayoutIndex = uVar23;
              local_80 = QFormLayoutItem::vStretch(this_02);
            }
            if (this_03 == (QFormLayoutItem *)0x0) {
              local_74 = 0xffffff;
            }
            else {
              local_74 = (this_03->maxSize).ht.m_i;
              uVar8 = (*this_03->item->_vptr_QLayoutItem[5])();
              if ((uVar8 & 2) != 0) {
                local_78 = 1;
              }
              bVar5 = true;
              if (this_02 == (QFormLayoutItem *)0x0) {
                bVar5 = this_03->fullRow ^ 1;
              }
              this_03->sideBySide = (bool)bVar5;
              this_03->vLayoutIndex = uVar23;
              iVar10 = QFormLayoutItem::vStretch(this_03);
            }
            pQVar15 = QList<QLayoutStruct>::data(this_00);
            if (iVar10 < local_80) {
              iVar10 = local_80;
            }
            if (RVar21.m_i < iVar11) {
              RVar21.m_i = iVar11;
            }
            pQVar15[(int)uVar23].stretch = iVar10;
            pQVar15[(int)uVar23].sizeHint = RVar21.m_i;
            pQVar15[(int)uVar23].minimumSize = RVar21.m_i;
            pQVar15[(int)uVar23].maximumSize = 0x7ffff;
            pQVar15[(int)uVar23].expansive = false;
            pQVar15[(int)uVar23].empty = true;
            pQVar15[(int)uVar23].spacing = 0;
            if (iVar9 < RVar19.m_i) {
              iVar9 = RVar19.m_i;
            }
            pQVar15 = QList<QLayoutStruct>::data(this_00);
            pQVar15[(int)uVar23].sizeHint = iVar9;
            if (local_7c < local_74) {
              local_74 = local_7c;
            }
            pQVar15 = QList<QLayoutStruct>::data(this_00);
            pQVar15[(int)uVar23].maximumSize = local_74;
            bVar4 = true;
            if ((local_78 & 1) == 0) {
              pQVar15 = QList<QLayoutStruct>::data(this_00);
              bVar4 = 0 < pQVar15[(int)uVar23].stretch;
            }
            pQVar15 = QList<QLayoutStruct>::data(this_00);
            pQVar15[(int)uVar23].expansive = bVar4;
            pQVar15 = QList<QLayoutStruct>::data(this_00);
            pQVar15[(int)uVar23].empty = false;
            pQVar15 = QList<QLayoutStruct>::data(this_00);
            if (pQVar15[(int)uVar23].expansive != false) {
              bVar6 = false;
            }
            if (1 < (int)uVar23) {
              pQVar16 = QLayout::parentWidget(layout);
              iVar11 = spacingHelper(pQVar16,local_90,userVSpacing,recalculate,this_02,this_03,
                                     prevItem1,local_a0);
              pQVar15 = QList<QLayoutStruct>::data(this_00);
              pQVar15[(ulong)uVar23 - 1].spacing = iVar11;
            }
            local_a0 = this_03;
            if (this_02 == (QFormLayoutItem *)0x0) {
              local_a0 = (QFormLayoutItem *)0x0;
              this_02 = this_03;
            }
            uVar23 = uVar23 + 1;
            prevItem1 = this_02;
            bVar4 = false;
          }
        }
        else {
          if (this_02 != (QFormLayoutItem *)0x0) {
            this_02->vLayoutIndex = -1;
          }
          bVar4 = recalculate;
          if (this_03 != (QFormLayoutItem *)0x0) {
            this_03->vLayoutIndex = -1;
          }
        }
        uVar20 = uVar20 + 1;
        lVar22 = lVar22 + 0x10;
        recalculate = bVar4;
      } while ((uVar3 & 0x7fffffff) != uVar20);
    }
    if (bVar6) {
      AVar12 = QFormLayout::formAlignment((QFormLayout *)layout);
      if (((uint)AVar12.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x40) == 0) {
        pQVar17 = QList<QLayoutStruct>::data(this_00);
        pQVar15 = pQVar17 + (int)uVar23;
        pQVar15->stretch = 1;
        pQVar15->sizeHint = 0;
        pQVar15->maximumSize = 0x7ffff;
        pQVar15->minimumSize = 0;
        pQVar17[(int)uVar23].expansive = false;
        pQVar17[(int)uVar23].empty = true;
        pQVar17[(int)uVar23].spacing = 0;
        pQVar15 = QList<QLayoutStruct>::data(this_00);
        pQVar15[(int)uVar23].expansive = true;
        uVar23 = uVar23 + 1;
      }
      pQVar15 = QList<QLayoutStruct>::data(this_00);
      if (((uint)AVar12.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xc0) == 0) {
        pQVar15->stretch = 0;
        pQVar15->sizeHint = 0;
        pQVar15->maximumSize = 0x7ffff;
        pQVar15->minimumSize = 0;
        pQVar15->expansive = false;
        pQVar15->empty = true;
        pQVar15->spacing = 0;
      }
      else {
        pQVar15->stretch = 1;
        pQVar15->sizeHint = 0;
        pQVar15->maximumSize = 0x7ffff;
        pQVar15->minimumSize = 0;
        pQVar15->expansive = false;
        pQVar15->empty = true;
        pQVar15->spacing = 0;
        pQVar15 = QList<QLayoutStruct>::data(this_00);
        pQVar15->expansive = true;
      }
    }
    else {
      pQVar15 = QList<QLayoutStruct>::data(this_00);
      pQVar15->stretch = 0;
      pQVar15->sizeHint = 0;
      pQVar15->maximumSize = 0x7ffff;
      pQVar15->minimumSize = 0;
      pQVar15->expansive = false;
      pQVar15->empty = true;
      pQVar15->spacing = 0;
    }
    this->vLayoutCount = uVar23;
    this->field_0xb2 = this->field_0xb2 & 0xf3;
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setupVerticalLayoutData(int width)
{
    Q_Q(QFormLayout);

    // Early out if we have no changes that would cause a change in vertical layout
    if ((width == layoutWidth || (width >= thresh_width && layoutWidth >= thresh_width)) && !dirty && !sizesDirty)
        return;

    layoutWidth = width;

    int rr = m_matrix.rowCount();
    int vidx = 1;
    QFormLayout::RowWrapPolicy rowWrapPolicy = q->rowWrapPolicy();
    bool wrapAllRows = (rowWrapPolicy == QFormLayout::WrapAllRows);
    bool addTopBottomStretch = true;

    vLayouts.clear();
    vLayouts.resize((2 * rr) + 2); // a max, some may be unused

    QStyle *style = nullptr;

    int userVSpacing = q->verticalSpacing();

    if (userVSpacing < 0) {
        if (QWidget *widget = q->parentWidget())
            style = widget->style();
    }

    // make sure our sizes are up to date
    updateSizes();

    // Grab the widest label width here
    // This might be different from the value computed during
    // sizeHint/minSize, since we don't count label/field pairs that
    // are split.
    maxLabelWidth = 0;
    if (!wrapAllRows) {
        for (int i = 0; i < rr; ++i) {
            const QFormLayoutItem *label = m_matrix(i, 0);
            const QFormLayoutItem *field = m_matrix(i, 1);
            if (label && (label->sizeHint.width() + (field ? field->minSize.width() : 0) <= width))
                maxLabelWidth = qMax(maxLabelWidth, label->sizeHint.width());
        }
    } else {
        maxLabelWidth = width;
    }

    QFormLayoutItem *prevItem1 = nullptr;
    QFormLayoutItem *prevItem2 = nullptr;
    bool prevRowSplit = false;

    for (int i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // Ignore empty rows or rows with only hidden items,
        // and invalidate their position in the layout.
        if (!q->isRowVisible(i)) {
            if (label)
                label->vLayoutIndex = -1;
            if (field)
                field->vLayoutIndex = -1;
            continue;
        }

        QSize min1;
        QSize min2;
        QSize sh1;
        QSize sh2;
        if (label) {
            min1 = label->minSize;
            sh1 = label->sizeHint;
        }
        if (field) {
            min2 = field->minSize;
            sh2 = field->sizeHint;
        }

        // In separate lines, we make a vLayout for everything that isn't null
        // in side by side, we only separate label/field if we're going to wrap it
        bool splitSideBySide = (rowWrapPolicy == QFormLayout::WrapLongRows)
                                && ((maxLabelWidth < sh1.width()) || (width < (maxLabelWidth + min2.width())));

        if (wrapAllRows || splitSideBySide) {
            if (label) {
                initLayoutStruct(vLayouts[vidx], label);

                if (vidx > 1)
                    vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, splitSideBySide || prevRowSplit, label, nullptr, prevItem1, prevItem2);

                label->vLayoutIndex = vidx;
                label->sideBySide = false;

                prevItem1 = label;
                prevItem2 = nullptr;

                if (vLayouts[vidx].stretch > 0)
                    addTopBottomStretch = false;

                ++vidx;
            }

            if (field) {
                initLayoutStruct(vLayouts[vidx], field);

                if (vidx > 1)
                    vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, splitSideBySide || prevRowSplit, field, nullptr, prevItem1, prevItem2);

                field->vLayoutIndex = vidx;
                field->sideBySide = false;

                prevItem1 = field;
                prevItem2 = nullptr;

                if (vLayouts[vidx].stretch > 0)
                    addTopBottomStretch = false;

                ++vidx;
            }

            prevRowSplit = splitSideBySide;
        } else {
            // we're in side by side mode, and we have enough space to do that
            QSize max1(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
            QSize max2(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);

            int stretch1 = 0;
            int stretch2 = 0;
            bool expanding = false;

            if (label) {
                max1 = label->maxSize;
                if (label->expandingDirections() & Qt::Vertical)
                    expanding = true;

                label->sideBySide = (field != nullptr);
                label->vLayoutIndex = vidx;
                stretch1 = label->vStretch();
            }

            if (field) {
                max2 = field->maxSize;
                if (field->expandingDirections() & Qt::Vertical)
                    expanding = true;

                field->sideBySide = (label || !field->fullRow);
                field->vLayoutIndex = vidx;
                stretch2 = field->vStretch();
            }

            vLayouts[vidx].init(qMax(stretch1, stretch2), qMax(min1.height(), min2.height()));
            vLayouts[vidx].sizeHint = qMax(sh1.height(), sh2.height());
            vLayouts[vidx].maximumSize = qMin(max1.height(), max2.height());
            vLayouts[vidx].expansive = expanding || (vLayouts[vidx].stretch > 0);
            vLayouts[vidx].empty = false;

            if (vLayouts[vidx].expansive)
                addTopBottomStretch = false;

            if (vidx > 1)
                vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, prevRowSplit, label, field, prevItem1, prevItem2);

            if (label) {
                prevItem1 = label;
                prevItem2 = field;
            } else {
                prevItem1 = field;
                prevItem2 = nullptr;
            }

            prevRowSplit = false;
            ++vidx;
        }
    }

    if (addTopBottomStretch) {
        Qt::Alignment formAlignment = q->formAlignment();

        if (!(formAlignment & Qt::AlignBottom)) {
            // AlignTop (default if unspecified) or AlignVCenter: We add a stretch at the bottom
            vLayouts[vidx].init(1, 0);
            vLayouts[vidx].expansive = true;
            ++vidx;
        }

        if (formAlignment & (Qt::AlignVCenter | Qt::AlignBottom)) {
            // AlignVCenter or AlignBottom: We add a stretch at the top
            vLayouts[0].init(1, 0);
            vLayouts[0].expansive = true;
        } else {
            vLayouts[0].init(0, 0);
        }
    } else {
        vLayouts[0].init(0, 0);
    }

    vLayoutCount = vidx;
    dirty = false;
}